

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void ptrmapPutOvflPtr(MemPage *pPage,u8 *pCell,int *pRC)

{
  uint uVar1;
  CellInfo info;
  CellInfo local_40;
  
  if (*pRC == 0) {
    btreeParseCellPtr(pPage,pCell,&local_40);
    if ((ulong)local_40.iOverflow != 0) {
      uVar1 = *(uint *)(pCell + local_40.iOverflow);
      ptrmapPut(pPage->pBt,
                uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18,
                '\x03',pPage->pgno,pRC);
      return;
    }
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, u8 *pCell, int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  btreeParseCellPtr(pPage, pCell, &info);
  assert( (info.nData+(pPage->intKey?0:info.nKey))==info.nPayload );
  if( info.iOverflow ){
    Pgno ovfl = get4byte(&pCell[info.iOverflow]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}